

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::AdvancedUnsizedArrayLength<1>::Run(AdvancedUnsizedArrayLength<1> *this)

{
  CallLogWrapper *this_00;
  undefined8 *puVar1;
  bool bVar2;
  GLuint GVar3;
  long *__dest;
  ostream *poVar4;
  void *data;
  uint *puVar5;
  byte bVar6;
  int *piVar7;
  int i_1;
  long lVar8;
  ulong uVar9;
  int i;
  uint *puVar10;
  string decl;
  size_type __dnew;
  string glsl_fs;
  string glsl_vs;
  ostringstream os;
  long *local_230;
  long local_228;
  long local_220 [2];
  long *local_210;
  long local_208;
  long local_200 [2];
  long local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  bVar2 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,0,4);
  lVar8 = 0x10;
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "\nvoid main() {\n  gl_Position = vec4(0,0,0,1);\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif"
               ,0x58);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n}",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,
               "\nlayout(std430, binding = 0) readonly buffer Input0 {\n  uint g_input0[];\n};\nlayout(std430, binding = 1) readonly buffer Input23 {\n  float data[];\n} g_input23[2];\nlayout(std430, binding = 3) buffer Output {\n  int g_length2;\n  int g_length[];\n};"
               ,"");
    local_1f0 = 0x9c;
    local_230 = local_220;
    __dest = (long *)std::__cxx11::string::_M_create((ulong *)&local_230,(ulong)&local_1f0);
    lVar8 = local_1f0;
    local_220[0] = local_1f0;
    local_230 = __dest;
    memcpy(__dest,
           "\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input23[0].data.length();\n  g_length[2] = g_input23[1].data.length();\n  g_length2 = g_length.length();"
           ,0x9c);
    local_228 = lVar8;
    *(undefined1 *)((long)__dest + lVar8) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(location = 0) out vec4 o_color;",0x27);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_210,local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);",0x34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_230,local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n}",2);
    std::__cxx11::stringbuf::str();
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_1c8,&local_1e8);
    this->m_program = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar8 = -1;
    if (bVar2) {
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
      data = operator_new(40000);
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)data + lVar8 * 4);
        *puVar1 = 0x2900000029;
        puVar1[1] = 0x2900000029;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 10000);
      piVar7 = &DAT_01b14af0;
      lVar8 = 0;
      do {
        glu::CallLogWrapper::glBindBufferBase
                  (this_00,0x90d2,(GLuint)lVar8,this->m_storage_buffer[lVar8]);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,(long)(*piVar7 << 2),data,0x88ea);
        lVar8 = lVar8 + 1;
        piVar7 = piVar7 + 1;
      } while (lVar8 != 4);
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
      puVar5 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x14,1);
      if (puVar5 == (uint *)0x0) {
        lVar8 = -1;
      }
      else {
        bVar6 = 1;
        puVar10 = &DAT_01b14af0;
        uVar9 = 0;
        do {
          if (puVar5[uVar9 + 1] != *puVar10) {
            bVar6 = 0;
            anon_unknown_0::Output("Array %d length is %d should be %d.\n",uVar9 & 0xffffffff);
          }
          uVar9 = uVar9 + 1;
          puVar10 = puVar10 + 1;
        } while (uVar9 != 3);
        if (*puVar5 != 4) {
          bVar6 = 0;
          anon_unknown_0::Output("Array %d length is %d should be %d.\n",3,(ulong)*puVar5,4);
        }
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        lVar8 = -(ulong)(~bVar6 & 1);
      }
      operator_delete(data,40000);
    }
  }
  return lVar8;
}

Assistant:

virtual long Run()
	{
		const int kSize = 10000;
		const int kBufs = 4;
		if ((stage == vertex && !IsVSFSAvailable(kBufs, 0)) || (stage == fragment && !IsVSFSAvailable(0, kBufs)))
			return NOT_SUPPORTED;
		if (stage == vertex)
		{
			std::string glsl_vs = BuildShader();
			std::string glsl_fs = BuildShaderPT(fragment);
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else if (stage == fragment)
		{
			std::string glsl_vs = BuildShaderPT(vertex);
			std::string glsl_fs = BuildShader();
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else
		{ // compute
			std::string glsl_cs = BuildShader();
			m_program			= CreateProgramCS(glsl_cs);
		}
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;
		glUseProgram(m_program);

		glGenBuffers(kBufs, m_storage_buffer);
		int				 sizes[kBufs] = { 7, 3, 4, 5 };
		std::vector<int> data(kSize, 41);
		for (int i = 0; i < kBufs; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizes[i] * 4, &data[0], GL_DYNAMIC_COPY);
		}

		if (stage != compute)
		{
			glGenVertexArrays(1, &m_vertex_array);
			glBindVertexArray(m_vertex_array);
			glDrawArrays(GL_POINTS, 0, 1);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
		int* dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizes[kBufs - 1], GL_MAP_READ_BIT);
		if (!dataout)
			return ERROR;
		bool status = true;
		for (int i = 0; i < kBufs - 1; ++i)
			if (dataout[i + 1] != sizes[i])
			{
				Output("Array %d length is %d should be %d.\n", i, dataout[i + 1], sizes[i]);
				status = false;
			}
		if (dataout[0] != sizes[kBufs - 1] - 1)
		{
			Output("Array %d length is %d should be %d.\n", kBufs - 1, dataout[0], sizes[kBufs - 1] - 1);
			status = false;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		if (!status)
			return ERROR;

		return NO_ERROR;
	}